

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

BinaryExpr<const_debugger_type_&,_const_type_safe::object_ref<debugger_type,_false>_&> * __thiscall
Catch::ExprLhs<debugger_type_const&>::operator!=
          (BinaryExpr<const_debugger_type_&,_const_type_safe::object_ref<debugger_type,_false>_&>
           *__return_storage_ptr__,ExprLhs<debugger_type_const&> *this,
          object_ref<debugger_type,_false> *rhs)

{
  debugger_type *lhs;
  bool comparisonResult;
  StringRef local_30;
  object_ref<debugger_type,_false> *local_20;
  object_ref<debugger_type,_false> *rhs_local;
  ExprLhs<const_debugger_type_&> *this_local;
  
  local_20 = rhs;
  rhs_local = (object_ref<debugger_type,_false> *)this;
  this_local = (ExprLhs<const_debugger_type_&> *)__return_storage_ptr__;
  comparisonResult =
       compareNotEqual<debugger_type,type_safe::object_ref<debugger_type,false>const&>
                 (*(debugger_type **)this,rhs);
  lhs = *(debugger_type **)this;
  StringRef::StringRef(&local_30,"!=");
  BinaryExpr<const_debugger_type_&,_const_type_safe::object_ref<debugger_type,_false>_&>::BinaryExpr
            (__return_storage_ptr__,comparisonResult,lhs,local_30,local_20);
  return __return_storage_ptr__;
}

Assistant:

auto operator != ( RhsT const& rhs ) -> BinaryExpr<LhsT, RhsT const&> const {
            return { compareNotEqual( m_lhs, rhs ), m_lhs, "!=", rhs };
        }